

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

bitwidth_t __thiscall slang::SVInt::countLeadingZs(SVInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar4 = 0;
  if ((this->super_SVIntStorage).unknownFlag == true) {
    uVar10 = (this->super_SVIntStorage).bitWidth;
    uVar11 = uVar10 & 0x3f;
    bVar6 = 0x40 - (char)uVar11;
    uVar10 = uVar10 + 0x3f;
    uVar9 = uVar10 >> 6;
    puVar1 = (this->super_SVIntStorage).field_0.pVal;
    if (uVar11 == 0) {
      bVar6 = 0;
      uVar11 = 0x40;
    }
    uVar5 = (puVar1[(ulong)uVar9 - 1] & puVar1[(ulong)(uVar9 * 2) - 1]) << (bVar6 & 0x3f) ^
            0xffffffffffffffff;
    if (uVar5 == 0) {
      uVar4 = 0x40;
    }
    else {
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar4 = (uint)lVar3 ^ 0x3f;
    }
    if (0x7f < uVar10 && uVar11 == uVar4) {
      uVar10 = uVar9 * 2 - 2;
      iVar7 = uVar9 - 1;
      uVar4 = uVar11;
      do {
        if ((puVar1[iVar7 - 1] & puVar1[uVar10]) != 0xffffffffffffffff) {
          uVar5 = puVar1[iVar7 - 1] & puVar1[uVar10] ^ 0xffffffffffffffff;
          if (uVar5 == 0) {
            uVar10 = 0x40;
          }
          else {
            lVar3 = 0x3f;
            if (uVar5 != 0) {
              for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
              }
            }
            uVar10 = (uint)lVar3 ^ 0x3f;
          }
          return uVar10 + uVar4;
        }
        uVar4 = uVar4 + 0x40;
        uVar10 = uVar10 - 1;
        iVar8 = iVar7 + -1;
        bVar2 = 0 < iVar7;
        iVar7 = iVar8;
      } while (iVar8 != 0 && bVar2);
    }
  }
  return uVar4;
}

Assistant:

bitwidth_t SVInt::countLeadingZs() const {
    if (!hasUnknown())
        return 0;

    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int words = (int)getNumWords(bitWidth, false);
    int i = words - 1;
    bitwidth_t count = (bitwidth_t)std::countl_one((pVal[i + words] & pVal[i]) << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            auto elem = pVal[i + words] & pVal[i];
            if (elem == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(elem);
                break;
            }
        }
    }

    return count;
}